

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptReflect.cpp
# Opt level: O3

Var Js::JavascriptReflect::EntryApply(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  RecyclableObject *thisArg;
  RecyclableObject *aValue;
  RecyclableObject *this;
  Var pvVar8;
  Type typeId;
  int in_stack_00000010;
  undefined1 local_78 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x153,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d01f71;
    *puVar6 = 0;
  }
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,(CallInfo *)&__tag.entry.next);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  aValue = (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           undefinedValue.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_78,function,(CallInfo)__tag.entry.next,
             L"Reflect.apply",&stack0x00000000);
  uVar4 = callInfo_local._0_4_;
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptReflect.cpp"
                                ,0x158,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) goto LAB_00d01f71;
    *puVar6 = 0;
    uVar4 = callInfo_local._0_4_;
  }
  if ((uVar4 >> 0x18 & 1) != 0) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ebf5,L"Reflect.apply");
  }
  pRVar7 = aValue;
  if ((uVar4 & 0xfffffe) != 0) {
    pRVar7 = (RecyclableObject *)Arguments::operator[]((Arguments *)&callInfo_local,1);
  }
  bVar3 = JavascriptConversion::IsCallable(pRVar7);
  if (!bVar3) {
    JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec34,L"Reflect.apply");
  }
  thisArg = aValue;
  if (2 < (callInfo_local._0_4_ & 0xffffff)) {
    thisArg = (RecyclableObject *)Arguments::operator[]((Arguments *)&callInfo_local,2);
  }
  if (((ulong)callInfo_local & 0xfffffc) != 0) {
    aValue = (RecyclableObject *)Arguments::operator[]((Arguments *)&callInfo_local,3);
  }
  if (aValue == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00d01f71;
    *puVar6 = 0;
LAB_00d01e3e:
    this = UnsafeVarTo<Js::RecyclableObject>(aValue);
    if (this == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00d01f71;
      *puVar6 = 0;
    }
    typeId = ((this->type).ptr)->typeId;
    if ((int)typeId < 0x58) goto LAB_00d01f2d;
    BVar5 = RecyclableObject::IsExternal(this);
    if (BVar5 != 0) goto LAB_00d01f2d;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar3) {
LAB_00d01f71:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  else {
    if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
      typeId = TypeIds_FirstNumberType;
      if ((((ulong)aValue & 0xffff000000000000) == 0x1000000000000) ||
         (typeId = TypeIds_Number, (ulong)aValue >> 0x32 != 0)) goto LAB_00d01f2d;
      goto LAB_00d01e3e;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00d01f71;
    typeId = TypeIds_FirstNumberType;
  }
  *puVar6 = 0;
LAB_00d01f2d:
  BVar5 = JavascriptOperators::IsObjectType(typeId);
  if (BVar5 != 0) {
    pRVar7 = VarTo<Js::RecyclableObject>(pRVar7);
    pvVar8 = JavascriptFunction::ApplyHelper(pRVar7,thisArg,aValue,pSVar1);
    AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry((AutoTagNativeLibraryEntry *)local_78);
    return pvVar8;
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5e9dc,L"Reflect.apply");
}

Assistant:

Var JavascriptReflect::EntryApply(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        Var undefinedValue = scriptContext->GetLibrary()->GetUndefined();
        AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Reflect.apply"));

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        if (args.Info.Flags & CallFlags_New)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_ErrorOnNew, _u("Reflect.apply"));
        }

        Var target = args.Info.Count > 1 ? args[1] : undefinedValue;
        if (!JavascriptConversion::IsCallable(target))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Reflect.apply"));
        }
        Var thisArgument = args.Info.Count > 2 ? args[2] : undefinedValue;
        Var argArray = args.Info.Count > 3 ? args[3] : undefinedValue;
        if (!(JavascriptOperators::IsObjectType(JavascriptOperators::GetTypeId(argArray))))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedArrayLike, _u("Reflect.apply"));
        }

        return JavascriptFunction::ApplyHelper(VarTo<RecyclableObject>(target), thisArgument, argArray, scriptContext);
    }